

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

Abc_Cex_t * Gia_ManBmcCexGen(Bmc_Mna_t *pMan,Gia_Man_t *p,int iOut)

{
  Gia_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Cex_t *pAVar4;
  Gia_Obj_t *pObj;
  int local_40;
  int local_3c;
  int iFrame;
  int iFramePi;
  int iOrigPi;
  int iSatVar;
  int iObjId;
  int i;
  Abc_Cex_t *pCex;
  int iOut_local;
  Gia_Man_t *p_local;
  Bmc_Mna_t *pMan_local;
  
  local_3c = 0;
  local_40 = -1;
  iVar1 = Gia_ManRegNum(p);
  iVar2 = Gia_ManPiNum(p);
  iVar3 = Gia_ManPoNum(p);
  pAVar4 = Abc_CexAlloc(iVar1,iVar2,iOut / iVar3 + 1);
  iVar1 = Gia_ManPoNum(p);
  pAVar4->iFrame = iOut / iVar1;
  iVar1 = Gia_ManPoNum(p);
  pAVar4->iPo = iOut % iVar1;
  for (iSatVar = 0; iVar1 = Vec_IntSize(pMan->vPiMap), iSatVar < iVar1; iSatVar = iSatVar + 1) {
    iVar1 = Vec_IntEntry(pMan->vPiMap,iSatVar);
    if (iVar1 < 0) {
      local_40 = -1 - iVar1;
    }
    else {
      p_00 = pMan->pFrames;
      pObj = Gia_ManPi(pMan->pFrames,local_3c);
      iVar2 = Gia_ObjId(p_00,pObj);
      iVar2 = Vec_IntEntry(pMan->vId2Var,iVar2);
      iVar2 = sat_solver_var_value(pMan->pSat,iVar2);
      if (iVar2 != 0) {
        iVar2 = Gia_ManRegNum(p);
        iVar3 = Gia_ManPiNum(p);
        Abc_InfoSetBit((uint *)(pAVar4 + 1),iVar2 + iVar3 * local_40 + iVar1);
      }
      local_3c = local_3c + 1;
    }
  }
  iVar1 = Gia_ManPiNum(pMan->pFrames);
  if (local_3c != iVar1) {
    __assert_fail("iFramePi == Gia_ManPiNum(pMan->pFrames)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcAnd.c"
                  ,0x2f6,"Abc_Cex_t *Gia_ManBmcCexGen(Bmc_Mna_t *, Gia_Man_t *, int)");
  }
  return pAVar4;
}

Assistant:

Abc_Cex_t * Gia_ManBmcCexGen( Bmc_Mna_t * pMan, Gia_Man_t * p, int iOut )
{
    Abc_Cex_t * pCex;
    int i, iObjId, iSatVar, iOrigPi;
    int iFramePi = 0, iFrame = -1;
    pCex = Abc_CexAlloc( Gia_ManRegNum(p), Gia_ManPiNum(p), iOut / Gia_ManPoNum(p) + 1 );
    pCex->iFrame = iOut / Gia_ManPoNum(p);
    pCex->iPo = iOut % Gia_ManPoNum(p);
    // fill in the input values
    Vec_IntForEachEntry( pMan->vPiMap, iOrigPi, i )
    {
        if ( iOrigPi < 0 )
        {
            iFrame = -iOrigPi-1;
            continue;
        }
        // iOrigPi in iFrame of pGia has PI index iFramePi in pMan->pFrames,
        iObjId = Gia_ObjId( pMan->pFrames, Gia_ManPi(pMan->pFrames, iFramePi) );
        iSatVar = Vec_IntEntry( pMan->vId2Var, iObjId );
        if ( sat_solver_var_value(pMan->pSat, iSatVar) )
            Abc_InfoSetBit( pCex->pData, Gia_ManRegNum(p) + Gia_ManPiNum(p) * iFrame + iOrigPi );
        iFramePi++;
    }
    assert( iFramePi == Gia_ManPiNum(pMan->pFrames) );
    return pCex;
}